

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O3

ion_status_t sl_delete(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  sl_node **ppsVar2;
  sl_node *psVar3;
  bool bVar4;
  char cVar5;
  sl_node *psVar6;
  long lVar7;
  ion_status_t iVar8;
  sl_node *psVar9;
  ion_sl_node_t *piVar10;
  uint uVar11;
  long lVar12;
  sl_node ***pppsVar13;
  ulong uVar14;
  
  psVar9 = skiplist->head;
  if ((long)psVar9->height < 0) {
    iVar8.error = '\x01';
    iVar8._1_3_ = 0;
    iVar8.count = 0;
  }
  else {
    iVar1 = (skiplist->super).record.key_size;
    uVar14 = 1;
    uVar11 = 0;
    lVar12 = (long)psVar9->height;
    do {
      if (psVar9->next[lVar12] != (sl_node *)0x0) {
        cVar5 = (*(skiplist->super).compare)(psVar9->next[lVar12]->key,key,iVar1);
        while (pppsVar13 = &psVar9->next, cVar5 < '\0') {
          psVar9 = (*pppsVar13)[lVar12];
          if (psVar9->next[lVar12] == (sl_node *)0x0) goto LAB_0010534b;
          cVar5 = (*(skiplist->super).compare)(psVar9->next[lVar12]->key,key,iVar1);
        }
        if ((psVar9->next[lVar12] != (sl_node *)0x0) &&
           (cVar5 = (*(skiplist->super).compare)(psVar9->next[lVar12]->key,key,iVar1), cVar5 == '\0'
           )) {
          psVar6 = (*pppsVar13)[lVar12];
          if (psVar6 == (sl_node *)0x0) {
LAB_00105345:
            uVar14 = 0;
          }
          else {
            do {
              cVar5 = (*(skiplist->super).compare)(psVar6->key,key,iVar1);
              if (cVar5 != '\0') goto LAB_00105345;
              psVar6 = (*pppsVar13)[lVar12];
              lVar7 = (long)psVar6->height;
              psVar3 = psVar9;
              if (-1 < lVar7) {
                do {
                  do {
                    piVar10 = psVar3;
                    ppsVar2 = piVar10->next;
                    psVar3 = ppsVar2[lVar7];
                  } while (psVar3 != psVar6);
                  ppsVar2[lVar7] = psVar6->next[lVar7];
                  bVar4 = 0 < lVar7;
                  psVar3 = piVar10;
                  lVar7 = lVar7 + -1;
                } while (bVar4);
              }
              free(psVar6->key);
              free(psVar6->value);
              free(psVar6->next);
              free(psVar6);
              uVar11 = uVar11 + 1;
              psVar6 = (*pppsVar13)[lVar12];
            } while (psVar6 != (sl_node *)0x0);
            uVar14 = 0;
          }
        }
      }
LAB_0010534b:
      bVar4 = 0 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar4);
    iVar8 = (ion_status_t)(uVar14 | (ulong)uVar11 << 0x20);
  }
  return iVar8;
}

Assistant:

ion_status_t
sl_delete(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	ion_key_size_t key_size = skiplist->super.record.key_size;
	/* Default return is no item */
	ion_status_t status;

	status			= ION_STATUS_INITIALIZE;
	/* If we fall through, then we didn't find what we were looking for. */
	status.error	= err_item_not_found;

	ion_sl_node_t	*cursor = skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; --h) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) < 0) {
			cursor = cursor->next[h];
		}

		if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
			ion_sl_node_t *oldcursor = cursor;

			while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0) {
				ion_sl_node_t	*tofree = cursor->next[h];
				ion_sl_node_t	*relink = cursor->next[h];
				ion_sl_level_t	link_h	= relink->height;

				while (link_h >= 0) {
					while (cursor->next[link_h] != relink) {
						cursor = cursor->next[link_h];
					}

					ion_sl_node_t *jump = relink->next[link_h];

					cursor->next[link_h] = jump;
					link_h--;
				}

				free(tofree->key);
				free(tofree->value);
				free(tofree->next);
				free(tofree);

				cursor = oldcursor;
				status.count++;
			}

			status.error = err_ok;
		}
	}

	return status;
}